

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debuginfo.cpp
# Opt level: O3

string * __thiscall
DebugInfo::WriteReport_abi_cxx11_
          (string *__return_storage_ptr__,DebugInfo *this,DebugFilters *filters)

{
  pointer pSVar1;
  pointer pTVar2;
  pointer pNVar3;
  pointer pCVar4;
  long lVar5;
  bool bVar6;
  pointer pNVar7;
  pointer pNVar8;
  pointer pOVar9;
  pointer pOVar10;
  pointer pNVar11;
  uint uVar12;
  SymbolInfo *sym_4;
  ulong uVar13;
  char *pcVar14;
  char *pcVar15;
  pointer pSVar16;
  uint uVar17;
  SymbolInfo *sym_6;
  pointer pCVar18;
  uint uVar19;
  __normal_iterator<SymbolInfo_*,_std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>_> __i;
  char *__needle;
  pointer pSVar20;
  pointer pTVar21;
  pointer pTVar22;
  long lVar23;
  pointer pNVar24;
  pointer pOVar25;
  pointer pOVar26;
  uint uVar27;
  _Alloc_hider _Var28;
  uint32_t uVar29;
  uint32_t uVar30;
  int iVar31;
  NamespaceInfo *n;
  pointer pOVar32;
  vector<SymbolInfo,_std::allocator<SymbolInfo>_> *__range1;
  string objFile;
  vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> objectFiles;
  vector<NamespaceInfo,_std::allocator<NamespaceInfo>_> nameSpaces;
  string local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> local_68;
  vector<NamespaceInfo,_std::allocator<NamespaceInfo>_> local_48;
  
  local_70 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_70;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __needle = (char *)(filters->name)._M_string_length;
  if (__needle != (char *)0x0) {
    __needle = (filters->name)._M_dataplus._M_p;
  }
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (__needle != (char *)0x0) {
    sAppendPrintF(__return_storage_ptr__,"Only including things with \'%s\' in their name/file\n\n",
                  __needle);
  }
  sAppendPrintF(__return_storage_ptr__,"Functions by size (kilobytes, min %.2f):\n",
                SUB84((double)filters->minFunction * 0.0009765625,0));
  pSVar16 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar1 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar16 != pSVar1) {
    uVar13 = ((long)pSVar1 - (long)pSVar16 >> 4) * -0x5555555555555555;
    lVar5 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<SymbolInfo*,std::vector<SymbolInfo,std::allocator<SymbolInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__0>>
              (pSVar16,pSVar1,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pSVar1 - (long)pSVar16 < 0x301) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<SymbolInfo*,std::vector<SymbolInfo,std::allocator<SymbolInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__0>>
                (pSVar16,pSVar1);
    }
    else {
      pSVar20 = pSVar16 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<SymbolInfo*,std::vector<SymbolInfo,std::allocator<SymbolInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__0>>
                (pSVar16,pSVar20);
      for (; pSVar20 != pSVar1; pSVar20 = pSVar20 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<SymbolInfo*,std::vector<SymbolInfo,std::allocator<SymbolInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__0>>
                  (pSVar20);
      }
    }
  }
  pSVar1 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar16 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pSVar16 != pSVar1 && ((uint)filters->minFunction <= pSVar16->size)); pSVar16 = pSVar16 + 1) {
    if (pSVar16->sectionType == Code) {
      pcVar15 = (pSVar16->name)._M_dataplus._M_p;
      GetObjectFileDesc_abi_cxx11_(&local_90,this,pSVar16->objectFileIndex);
      _Var28._M_p = local_90._M_dataplus._M_p;
      if (((__needle == (char *)0x0) ||
          (pcVar14 = strstr(pcVar15,__needle), _Var28._M_p = local_90._M_dataplus._M_p,
          pcVar14 != (char *)0x0)) ||
         (pcVar14 = strstr(local_90._M_dataplus._M_p,__needle), pcVar14 != (char *)0x0)) {
        sAppendPrintF(__return_storage_ptr__,"%5d.%02d: %-80s %s\n",(ulong)(pSVar16->size >> 10),
                      (ulong)((pSVar16->size & 0x3ff) * 100 >> 10),pcVar15,_Var28._M_p);
        iVar31 = 0;
        bVar6 = true;
        _Var28._M_p = local_90._M_dataplus._M_p;
      }
      else {
        iVar31 = 3;
        bVar6 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var28._M_p != &local_90.field_2) {
        operator_delete(_Var28._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (((!bVar6) && (iVar31 != 3)) && (iVar31 != 0)) break;
    }
  }
  sAppendPrintF(__return_storage_ptr__,
                "\nAggregated templates by size (kilobytes, min %.2f / %i):\n",
                SUB84((double)filters->minTemplate * 0.0009765625,0),
                (ulong)(uint)filters->minTemplateCount);
  pTVar22 = (this->m_Templates).super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (this->m_Templates).super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pTVar22 != pTVar2) {
    uVar13 = ((long)pTVar2 - (long)pTVar22 >> 3) * -0x3333333333333333;
    lVar5 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<TemplateInfo*,std::vector<TemplateInfo,std::allocator<TemplateInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__1>>
              (pTVar22,pTVar2,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pTVar2 - (long)pTVar22 < 0x281) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<TemplateInfo*,std::vector<TemplateInfo,std::allocator<TemplateInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__1>>
                (pTVar22,pTVar2);
    }
    else {
      pTVar21 = pTVar22 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<TemplateInfo*,std::vector<TemplateInfo,std::allocator<TemplateInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__1>>
                (pTVar22,pTVar21);
      for (; pTVar21 != pTVar2; pTVar21 = pTVar21 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<TemplateInfo*,std::vector<TemplateInfo,std::allocator<TemplateInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__1>>
                  (pTVar21);
      }
    }
  }
  pTVar2 = (this->m_Templates).super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pTVar22 = (this->m_Templates).super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      (pTVar22 != pTVar2 && (uVar12 = pTVar22->size, (uint)filters->minTemplate <= uVar12));
      pTVar22 = pTVar22 + 1) {
    uVar17 = pTVar22->count;
    if (((uint)filters->minTemplateCount <= uVar17) &&
       ((pcVar15 = (pTVar22->name)._M_dataplus._M_p, __needle == (char *)0x0 ||
        (pcVar14 = strstr(pcVar15,__needle), pcVar14 != (char *)0x0)))) {
      sAppendPrintF(__return_storage_ptr__,"%5d.%02d #%5d: %s\n",(ulong)(uVar12 >> 10),
                    (ulong)((uVar12 & 0x3ff) * 100 >> 10),(ulong)uVar17,pcVar15);
    }
  }
  sAppendPrintF(__return_storage_ptr__,"\nData by size (kilobytes, min %.2f):\n",
                SUB84((double)filters->minData * 0.0009765625,0));
  pSVar1 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar16 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pSVar16 != pSVar1 && ((uint)filters->minData <= pSVar16->size)); pSVar16 = pSVar16 + 1) {
    if (pSVar16->sectionType == Data) {
      pcVar15 = (pSVar16->name)._M_dataplus._M_p;
      GetObjectFileDesc_abi_cxx11_(&local_90,this,pSVar16->objectFileIndex);
      _Var28._M_p = local_90._M_dataplus._M_p;
      if (((__needle == (char *)0x0) ||
          (pcVar14 = strstr(pcVar15,__needle), _Var28._M_p = local_90._M_dataplus._M_p,
          pcVar14 != (char *)0x0)) ||
         (pcVar14 = strstr(local_90._M_dataplus._M_p,__needle), pcVar14 != (char *)0x0)) {
        sAppendPrintF(__return_storage_ptr__,"%5d.%02d: %-50s %s\n",(ulong)(pSVar16->size >> 10),
                      (ulong)((pSVar16->size & 0x3ff) * 100 >> 10),pcVar15,_Var28._M_p);
        iVar31 = 0;
        bVar6 = true;
        _Var28._M_p = local_90._M_dataplus._M_p;
      }
      else {
        iVar31 = 7;
        bVar6 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var28._M_p != &local_90.field_2) {
        operator_delete(_Var28._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (((!bVar6) && (iVar31 != 7)) && (iVar31 != 0)) break;
    }
  }
  sAppendPrintF(__return_storage_ptr__,"\nBSS by size (kilobytes, min %.2f):\n",
                SUB84((double)filters->minData * 0.0009765625,0));
  pSVar1 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar16 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pSVar16 != pSVar1 && ((uint)filters->minData <= pSVar16->size)); pSVar16 = pSVar16 + 1) {
    if (pSVar16->sectionType == BSS) {
      pcVar15 = (pSVar16->name)._M_dataplus._M_p;
      GetObjectFileDesc_abi_cxx11_(&local_90,this,pSVar16->objectFileIndex);
      _Var28._M_p = local_90._M_dataplus._M_p;
      if (((__needle == (char *)0x0) ||
          (pcVar14 = strstr(pcVar15,__needle), _Var28._M_p = local_90._M_dataplus._M_p,
          pcVar14 != (char *)0x0)) ||
         (pcVar14 = strstr(local_90._M_dataplus._M_p,__needle), pcVar14 != (char *)0x0)) {
        sAppendPrintF(__return_storage_ptr__,"%5d.%02d: %-50s %s\n",(ulong)(pSVar16->size >> 10),
                      (ulong)((pSVar16->size & 0x3ff) * 100 >> 10),pcVar15,_Var28._M_p);
        iVar31 = 0;
        bVar6 = true;
        _Var28._M_p = local_90._M_dataplus._M_p;
      }
      else {
        iVar31 = 9;
        bVar6 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var28._M_p != &local_90.field_2) {
        operator_delete(_Var28._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (((!bVar6) && (iVar31 != 9)) && (iVar31 != 0)) break;
    }
  }
  sAppendPrintF(__return_storage_ptr__,"\nClasses/Namespaces by code size (kilobytes, min %.2f):\n",
                SUB84((double)filters->minClass * 0.0009765625,0));
  local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar24 = (this->m_Namespaces).super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pNVar3 = (this->m_Namespaces).super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pNVar7 = local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pNVar8 = local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pNVar24 != pNVar3) {
    do {
      if ((uint)filters->minClass <= pNVar24->codeSize) {
        std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>::push_back(&local_48,pNVar24);
      }
      pNVar11 = local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pNVar7 = local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
      pNVar24 = pNVar24 + 1;
    } while (pNVar24 != pNVar3);
    pNVar8 = local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar23 = (long)local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      uVar13 = (lVar23 >> 4) * -0x5555555555555555;
      lVar5 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<NamespaceInfo*,std::vector<NamespaceInfo,std::allocator<NamespaceInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__2>>
                (local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar23 < 0x301) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<NamespaceInfo*,std::vector<NamespaceInfo,std::allocator<NamespaceInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__2>>
                  (pNVar7,pNVar11);
        pNVar7 = local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pNVar8 = local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      else {
        pNVar24 = pNVar7 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<NamespaceInfo*,std::vector<NamespaceInfo,std::allocator<NamespaceInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__2>>
                  (pNVar7,pNVar24);
        for (; pNVar7 = local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
                        _M_impl.super__Vector_impl_data._M_start,
            pNVar8 = local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
                     _M_impl.super__Vector_impl_data._M_finish, pNVar24 != pNVar11;
            pNVar24 = pNVar24 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<NamespaceInfo*,std::vector<NamespaceInfo,std::allocator<NamespaceInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__2>>
                    (pNVar24);
        }
      }
    }
  }
  for (; pNVar24 = local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
      pNVar7 != local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
                super__Vector_impl_data._M_finish; pNVar7 = pNVar7 + 1) {
    pcVar15 = (pNVar7->name)._M_dataplus._M_p;
    local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = pNVar8;
    if ((__needle == (char *)0x0) || (pcVar14 = strstr(pcVar15,__needle), pcVar14 != (char *)0x0)) {
      sAppendPrintF(__return_storage_ptr__,"%5d.%02d: %s\n",(ulong)(pNVar7->codeSize >> 10),
                    (ulong)((pNVar7->codeSize & 0x3ff) * 100 >> 10),pcVar15);
    }
    pNVar8 = local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = pNVar24;
  }
  local_48.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = pNVar8;
  sAppendPrintF(__return_storage_ptr__,"\nObject files by code size (kilobytes, min %.2f):\n",
                SUB84((double)filters->minFile * 0.0009765625,0));
  local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pOVar32 = (this->m_ObjectFiles).
            super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pOVar26 = (this->m_ObjectFiles).
            super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pOVar32 != pOVar26) {
    do {
      if (((uint)filters->minFile <= pOVar32->codeSize) ||
         ((uint)filters->minFile <= pOVar32->contribCodeSize)) {
        std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::push_back(&local_68,pOVar32);
      }
      pOVar10 = local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl
                .super__Vector_impl_data._M_finish;
      pOVar9 = local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
      pOVar32 = pOVar32 + 1;
    } while (pOVar32 != pOVar26);
    if (local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar23 = (long)local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      uVar13 = (lVar23 >> 3) * 0x2e8ba2e8ba2e8ba3;
      lVar5 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__3>>
                (local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar23 < 0x581) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__3>>
                  (pOVar9,pOVar10);
      }
      else {
        pOVar25 = pOVar9 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__3>>
                  (pOVar9,pOVar25);
        for (; pOVar25 != pOVar10; pOVar25 = pOVar25 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__3>>
                    (pOVar25);
        }
      }
    }
  }
  pOVar32 = local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pOVar26 = local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      GetObjectFileDesc_abi_cxx11_(&local_90,this,pOVar26->index);
      if ((__needle == (char *)0x0) ||
         (pcVar15 = strstr(local_90._M_dataplus._M_p,__needle), pcVar15 != (char *)0x0)) {
        uVar12 = pOVar26->codeSize;
        uVar17 = pOVar26->contribCodeSize;
        uVar13 = (ulong)((uVar17 & 0x3ff) * 100 >> 10);
        if ((float)uVar17 <= (float)uVar12 * 1.2) {
          sAppendPrintF(__return_storage_ptr__,"%5d.%02d: %s\n",(ulong)(uVar17 >> 10),uVar13,
                        local_90._M_dataplus._M_p);
        }
        else {
          sAppendPrintF(__return_storage_ptr__,"%5d.%02d: %s [%d.%02d with symbols]\n",
                        (ulong)(uVar17 >> 10),uVar13,local_90._M_dataplus._M_p,(ulong)(uVar12 >> 10)
                        ,(uVar12 & 0x3ff) * 100 >> 10);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      pOVar26 = pOVar26 + 1;
    } while (pOVar26 != pOVar32);
  }
  sAppendPrintF(__return_storage_ptr__,"\nObject files by data size (kilobytes, min %.2f):\n",
                SUB84((double)filters->minFile * 0.0009765625,0));
  std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::_M_erase_at_end
            (&local_68,
             local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
             super__Vector_impl_data._M_start);
  pOVar32 = (this->m_ObjectFiles).
            super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pOVar26 = (this->m_ObjectFiles).
            super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pOVar32 != pOVar26) {
    do {
      if (((uint)filters->minFile <= pOVar32->dataSize) ||
         ((uint)filters->minFile <= pOVar32->contribDataSize)) {
        std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::push_back(&local_68,pOVar32);
      }
      pOVar32 = pOVar32 + 1;
    } while (pOVar32 != pOVar26);
  }
  pOVar26 = local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pOVar32 = local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar23 = (long)local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    uVar13 = (lVar23 >> 3) * 0x2e8ba2e8ba2e8ba3;
    lVar5 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__4>>
              (local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar23 < 0x581) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__4>>
                (pOVar32,pOVar26);
    }
    else {
      pOVar25 = pOVar32 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__4>>
                (pOVar32,pOVar25);
      for (; pOVar25 != pOVar26; pOVar25 = pOVar25 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__4>>
                  ();
      }
    }
  }
  pOVar32 = local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pOVar26 = local_68.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      GetObjectFileDesc_abi_cxx11_(&local_90,this,pOVar26->index);
      if ((__needle == (char *)0x0) ||
         (pcVar15 = strstr(local_90._M_dataplus._M_p,__needle), pcVar15 != (char *)0x0)) {
        uVar12 = pOVar26->dataSize;
        uVar17 = pOVar26->contribDataSize;
        uVar13 = (ulong)((uVar17 & 0x3ff) * 100 >> 10);
        if ((float)uVar17 <= (float)uVar12 * 1.2) {
          sAppendPrintF(__return_storage_ptr__,"%5d.%02d: %s\n",(ulong)(uVar17 >> 10),uVar13,
                        local_90._M_dataplus._M_p);
        }
        else {
          sAppendPrintF(__return_storage_ptr__,"%5d.%02d: %s [%d.%02d with symbols]\n",
                        (ulong)(uVar17 >> 10),uVar13,local_90._M_dataplus._M_p,(ulong)(uVar12 >> 10)
                        ,(uVar12 & 0x3ff) * 100 >> 10);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      pOVar26 = pOVar26 + 1;
    } while (pOVar26 != pOVar32);
  }
  pCVar18 = (this->m_Contribs).super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl
            .super__Vector_impl_data._M_start;
  pCVar4 = (this->m_Contribs).super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar12 = 0;
  uVar17 = 0;
  uVar19 = 0;
  if (pCVar18 != pCVar4) {
    uVar19 = 0;
    uVar17 = 0;
    do {
      uVar29 = pCVar18->size;
      uVar30 = 0;
      if (pCVar18->sectionType == Code) {
        uVar30 = uVar29;
      }
      uVar17 = uVar17 + uVar30;
      if (pCVar18->sectionType != Data) {
        uVar29 = 0;
      }
      uVar19 = uVar19 + uVar29;
      pCVar18 = pCVar18 + 1;
    } while (pCVar18 != pCVar4);
  }
  pSVar16 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar1 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar16 != pSVar1) {
    uVar12 = 0;
    do {
      uVar29 = 0;
      if (pSVar16->sectionType == Code) {
        uVar29 = pSVar16->size;
      }
      uVar12 = uVar12 + uVar29;
      pSVar16 = pSVar16 + 1;
    } while (pSVar16 != pSVar1);
  }
  uVar27 = 0;
  sAppendPrintF(__return_storage_ptr__,"\nOverall code:  %5d.%02d kb (%d.%02d with symbols)\n",
                (ulong)(uVar17 >> 10),(ulong)((uVar17 & 0x3ff) * 100 >> 10),(ulong)(uVar12 >> 10),
                (ulong)((uVar12 & 0x3ff) * 100 >> 10));
  pSVar16 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar1 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar16 != pSVar1) {
    uVar27 = 0;
    do {
      uVar29 = 0;
      if (pSVar16->sectionType == Data) {
        uVar29 = pSVar16->size;
      }
      uVar27 = uVar27 + uVar29;
      pSVar16 = pSVar16 + 1;
    } while (pSVar16 != pSVar1);
  }
  uVar12 = 0;
  sAppendPrintF(__return_storage_ptr__,"Overall data:  %5d.%02d kb (%d.%02d with symbols)\n",
                (ulong)(uVar19 >> 10),(ulong)((uVar19 & 0x3ff) * 100 >> 10),(ulong)(uVar27 >> 10),
                (ulong)((uVar27 & 0x3ff) * 100 >> 10));
  pSVar16 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar1 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar16 != pSVar1) {
    uVar12 = 0;
    do {
      uVar29 = 0;
      if (pSVar16->sectionType == BSS) {
        uVar29 = pSVar16->size;
      }
      uVar12 = uVar12 + uVar29;
      pSVar16 = pSVar16 + 1;
    } while (pSVar16 != pSVar1);
  }
  sAppendPrintF(__return_storage_ptr__,"Overall BSS:   %5d.%02d kb\n",(ulong)(uVar12 >> 10),
                (ulong)((uVar12 & 0x3ff) * 100 >> 10));
  pSVar16 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar1 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar16 != pSVar1) {
    uVar12 = 0;
    do {
      uVar29 = 0;
      if (pSVar16->sectionType == Unknown) {
        uVar29 = pSVar16->size;
      }
      uVar12 = uVar12 + uVar29;
      pSVar16 = pSVar16 + 1;
    } while (pSVar16 != pSVar1);
    if (uVar12 != 0) {
      sAppendPrintF(__return_storage_ptr__,"Overall other: %5d.%02d kb\n",(ulong)(uVar12 >> 10),
                    (ulong)((uVar12 & 0x3ff) * 100 >> 10));
    }
  }
  std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::~vector(&local_68);
  std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string DebugInfo::WriteReport(const DebugFilters& filters)
{
    std::string Report;
    const char* filterName = filters.name.empty() ? NULL : filters.name.c_str();

    Report.reserve(64 * 1024);
    if (filterName)
    {
        sAppendPrintF(Report, "Only including things with '%s' in their name/file\n\n", filterName);
    }

    // symbols
    sAppendPrintF(Report, "Functions by size (kilobytes, min %.2f):\n", filters.minFunction/1024.0);
    std::sort(m_Symbols.begin(), m_Symbols.end(), [](const auto& a, const auto& b) {
        if (a.size != b.size)
            return a.size > b.size;
        if (a.objectFileIndex != b.objectFileIndex)
            return a.objectFileIndex < b.objectFileIndex;
        return a.name < b.name;
    });

    for (const auto& sym : m_Symbols)
    {
        if (sym.size < filters.minFunction)
            break;
        if (sym.sectionType == SectionType::Code)
        {
            const char* name1 = sym.name.c_str();
            std::string objFile = GetObjectFileDesc(sym.objectFileIndex);
            if (filterName && !strstr(name1, filterName) && !strstr(objFile.c_str(), filterName))
                continue;
            sAppendPrintF(Report, "%5d.%02d: %-80s %s\n",
                sym.size / 1024, (sym.size % 1024) * 100 / 1024,
                name1, objFile.c_str());
        }
    }

    // templates
    sAppendPrintF(Report, "\nAggregated templates by size (kilobytes, min %.2f / %i):\n", filters.minTemplate/1024.0, filters.minTemplateCount);

    std::sort(m_Templates.begin(), m_Templates.end(), [](const auto& a, const auto& b) {
        if (a.size != b.size)
            return a.size > b.size;
        if (a.count != b.count)
            return a.count > b.count;
        return a.name < b.name;
    });

    for (const auto& tpl : m_Templates)
    {
        if (tpl.size < filters.minTemplate)
            break;
        if (tpl.count < filters.minTemplateCount)
            continue;
        const char* name1 = tpl.name.c_str();
        if (filterName && !strstr(name1, filterName))
            continue;
        sAppendPrintF(Report, "%5d.%02d #%5d: %s\n",
            tpl.size / 1024, (tpl.size % 1024) * 100 / 1024,
            tpl.count,
            name1);
    }

    sAppendPrintF(Report, "\nData by size (kilobytes, min %.2f):\n", filters.minData/1024.0);
    for (const auto& sym : m_Symbols)
    {
        if (sym.size < filters.minData)
            break;
        if (sym.sectionType == SectionType::Data)
        {
            const char* name1 = sym.name.c_str();
            std::string objFile = GetObjectFileDesc(sym.objectFileIndex);
            if (filterName && !strstr(name1, filterName) && !strstr(objFile.c_str(), filterName))
                continue;
            sAppendPrintF(Report, "%5d.%02d: %-50s %s\n",
                sym.size / 1024, (sym.size % 1024) * 100 / 1024,
                name1, objFile.c_str());
        }
    }

    sAppendPrintF(Report, "\nBSS by size (kilobytes, min %.2f):\n", filters.minData/1024.0);
    for (const auto& sym : m_Symbols)
    {
        if (sym.size < filters.minData)
            break;
        if (sym.sectionType == SectionType::BSS)
        {
            const char* name1 = sym.name.c_str();
            std::string objFile = GetObjectFileDesc(sym.objectFileIndex);
            if (filterName && !strstr(name1, filterName) && !strstr(objFile.c_str(), filterName))
                continue;
            sAppendPrintF(Report, "%5d.%02d: %-50s %s\n",
                sym.size / 1024, (sym.size % 1024) * 100 / 1024,
                name1, objFile.c_str());
        }
    }

    sAppendPrintF(Report, "\nClasses/Namespaces by code size (kilobytes, min %.2f):\n", filters.minClass/1024.0);
    std::vector<NamespaceInfo> nameSpaces;
    for (const auto& n : m_Namespaces)
    {
        if (n.codeSize >= filters.minClass)
            nameSpaces.push_back(n);
    }
    std::sort(nameSpaces.begin(), nameSpaces.end(), [](const auto& a, const auto& b)
    {
        if (a.codeSize != b.codeSize)
            return a.codeSize > b.codeSize;
        if (a.dataSize != b.dataSize)
            return a.dataSize > b.dataSize;
        return a.name < b.name;
    });
    for (const auto& n : nameSpaces)
    {
        const std::string& name = n.name;
        if (filterName && !strstr(name.c_str(), filterName))
            continue;
        sAppendPrintF(Report, "%5d.%02d: %s\n",
            n.codeSize / 1024, (n.codeSize % 1024) * 100 / 1024, name.c_str());
    }

    sAppendPrintF(Report, "\nObject files by code size (kilobytes, min %.2f):\n", filters.minFile/1024.0);
    std::vector<ObjectFileInfo> objectFiles;
    for (const auto& f : m_ObjectFiles)
    {
        if (f.codeSize >= filters.minFile || f.contribCodeSize >= filters.minFile)
            objectFiles.push_back(f);
    }
    std::sort(objectFiles.begin(), objectFiles.end(), [](const ObjectFileInfo& a, const ObjectFileInfo& b) {
        if (a.contribCodeSize != b.contribCodeSize)
            return a.contribCodeSize > b.contribCodeSize;
        if (a.codeSize != b.codeSize)
            return a.codeSize > b.codeSize;
        return a.index < b.index;
    });
    for (const auto& f : objectFiles)
    {
        std::string objFile = GetObjectFileDesc(f.index);
        if (filterName && !strstr(objFile.c_str(), filterName))
            continue;

        if (f.codeSize * 1.2f >= f.contribCodeSize)
        {
            sAppendPrintF(Report, "%5d.%02d: %s\n",
                f.contribCodeSize / 1024, (f.contribCodeSize % 1024) * 100 / 1024,
                objFile.c_str());
        }
        else
        {
            sAppendPrintF(Report, "%5d.%02d: %s [%d.%02d with symbols]\n",
                f.contribCodeSize / 1024, (f.contribCodeSize % 1024) * 100 / 1024,
                objFile.c_str(),
                f.codeSize / 1024, (f.codeSize % 1024) * 100 / 1024);
        }
    }

    sAppendPrintF(Report, "\nObject files by data size (kilobytes, min %.2f):\n", filters.minFile / 1024.0);
    objectFiles.clear();
    for (const auto& f : m_ObjectFiles)
    {
        if (f.dataSize >= filters.minFile || f.contribDataSize >= filters.minFile)
            objectFiles.push_back(f);
    }
    std::sort(objectFiles.begin(), objectFiles.end(), [](const ObjectFileInfo& a, const ObjectFileInfo& b) {
        if (a.contribDataSize != b.contribDataSize)
            return a.contribDataSize > b.contribDataSize;
        if (a.dataSize != b.dataSize)
            return a.dataSize > b.dataSize;
        return a.index < b.index;
        });
    for (const auto& f : objectFiles)
    {
        std::string objFile = GetObjectFileDesc(f.index);
        if (filterName && !strstr(objFile.c_str(), filterName))
            continue;

        if (f.dataSize * 1.2f >= f.contribDataSize)
        {
            sAppendPrintF(Report, "%5d.%02d: %s\n",
                f.contribDataSize / 1024, (f.contribDataSize % 1024) * 100 / 1024,
                objFile.c_str());
        }
        else
        {
            sAppendPrintF(Report, "%5d.%02d: %s [%d.%02d with symbols]\n",
                f.contribDataSize / 1024, (f.contribDataSize % 1024) * 100 / 1024,
                objFile.c_str(),
                f.dataSize / 1024, (f.dataSize % 1024) * 100 / 1024);
        }
    }


    uint32_t contribCodeSize = 0, contribDataSize = 0;
    for (const auto& cnt : m_Contribs)
    {
        if (cnt.sectionType == SectionType::Code)
            contribCodeSize += cnt.size;
        if (cnt.sectionType == SectionType::Data)
            contribDataSize += cnt.size;
    }

    uint32_t size;
    size = CountSizeInSection(SectionType::Code);
    sAppendPrintF(Report, "\nOverall code:  %5d.%02d kb (%d.%02d with symbols)\n", contribCodeSize / 1024, (contribCodeSize % 1024) * 100 / 1024, size / 1024, (size % 1024) * 100 / 1024);

    size = CountSizeInSection(SectionType::Data);
    sAppendPrintF(Report, "Overall data:  %5d.%02d kb (%d.%02d with symbols)\n", contribDataSize / 1024, (contribDataSize % 1024) * 100 / 1024, size / 1024, (size % 1024) * 100 / 1024);

    size = CountSizeInSection(SectionType::BSS);
    sAppendPrintF(Report, "Overall BSS:   %5d.%02d kb\n", size / 1024,
        (size % 1024) * 100 / 1024);

    size = CountSizeInSection(SectionType::Unknown);
    if (size > 0)
    {
        sAppendPrintF(Report, "Overall other: %5d.%02d kb\n", size / 1024,
            (size % 1024) * 100 / 1024);
    }

    return Report;
}